

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

Expression *
slang::ast::Expression::tryBindInterfaceRef
          (ASTContext *context,ExpressionSyntax *syntax,bool isInterfacePort)

{
  SourceRange range;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange range_00;
  SourceRange sourceRange_03;
  SourceRange range_01;
  SourceRange sourceRange_04;
  SourceRange sourceRange_05;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  string_view arg_03;
  string_view arg_04;
  string_view name;
  span<const_slang::ConstantRange,_18446744073709551615UL> dimensions;
  DeferredSourceRange sourceRange_06;
  span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL> selectors_00;
  bool bVar1;
  NameSyntax *pNVar2;
  SyntaxNode *pSVar3;
  reference ppSVar4;
  Scope *this;
  InstanceSymbol *pIVar5;
  Symbol *pSVar6;
  VirtualInterfaceType *scope;
  Type *pTVar7;
  byte in_DL;
  SyntaxNode *in_RSI;
  HierarchicalReference hierRef;
  Type *type;
  Diagnostic *diag_4;
  Symbol *sym;
  Diagnostic *diag_3;
  ResolvedConfig *rc;
  Diagnostic *diag_2;
  SyntaxNode *source;
  Diagnostic *diag_1;
  InstanceBodySymbol *iface;
  SourceRange sourceRange;
  Diagnostic *diag;
  InstanceArraySymbol *array;
  Symbol *origSymbol;
  SmallVector<slang::ConstantRange,_4UL> dims;
  variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector> *sel
  ;
  iterator __end4;
  iterator __begin4;
  SmallVector<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_4UL>
  *__range4;
  SmallVector<const_slang::syntax::ElementSelectSyntax_*,_5UL> selectors;
  ModportSymbol *modport;
  InterfacePortSymbol *ifacePort;
  Symbol *symbol;
  Compilation *comp;
  Symbol *found;
  LookupResult result2;
  ScopedNameSyntax *scoped;
  string_view arrayModportName;
  DeferredSourceRange modportRange;
  LookupFlags flags;
  LookupResult result;
  ExpressionSyntax *expr;
  SourceLocation in_stack_fffffffffffff4a8;
  SourceLocation in_stack_fffffffffffff4b0;
  SourceLocation in_stack_fffffffffffff4b8;
  undefined4 in_stack_fffffffffffff4c0;
  DiagCode in_stack_fffffffffffff4c4;
  InstanceSymbol *in_stack_fffffffffffff4c8;
  SourceLocation in_stack_fffffffffffff4d0;
  Compilation *pCVar8;
  SourceLocation in_stack_fffffffffffff4d8;
  InstanceBodySymbol *in_stack_fffffffffffff4e0;
  DiagCode code;
  LookupResult *in_stack_fffffffffffff4e8;
  Compilation *in_stack_fffffffffffff4f0;
  size_t in_stack_fffffffffffff4f8;
  SyntaxNode *in_stack_fffffffffffff500;
  Scope *in_stack_fffffffffffff508;
  size_t in_stack_fffffffffffff510;
  char *in_stack_fffffffffffff518;
  __extent_storage<18446744073709551615UL> _Var9;
  SourceLocation in_stack_fffffffffffff530;
  SourceLocation in_stack_fffffffffffff538;
  PointerIntPair<const_slang::syntax::SyntaxNode_*,_1U,_1U,_bool> in_stack_fffffffffffff540;
  HierarchyOverrideNode *in_stack_fffffffffffff558;
  LookupResult *in_stack_fffffffffffff598;
  ASTContext *in_stack_fffffffffffff5a0;
  Symbol *in_stack_fffffffffffff5a8;
  pointer in_stack_fffffffffffff5b0;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff5b8;
  SourceLocation SStack_840;
  LookupResult *in_stack_fffffffffffff880;
  ASTContext *in_stack_fffffffffffff888;
  NameSyntax *in_stack_fffffffffffff890;
  bitmask<slang::ast::LookupFlags> in_stack_fffffffffffff89c;
  InstanceBodySymbol *local_6c0;
  SourceRange local_6b8;
  SourceLocation local_6a8;
  undefined4 local_69c;
  size_t local_698;
  char *pcStack_690;
  SourceRange local_680;
  undefined4 local_66c;
  Diagnostic *local_668;
  SourceRange local_660;
  undefined8 local_650;
  InstanceArraySymbol *local_648;
  LookupResult *local_640;
  SmallVectorBase<slang::ConstantRange> local_638 [2];
  iterator local_5f0;
  iterator local_5e8;
  iterator local_5e0;
  SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  *local_5d8;
  IfaceConn local_580;
  bitmask<slang::ast::LookupResultFlags> local_569;
  SourceLocation local_568;
  InterfacePortSymbol *local_560;
  InstanceSymbol *local_558;
  Compilation *local_550;
  undefined4 local_544;
  undefined8 local_540;
  undefined8 local_538;
  undefined8 local_530;
  int *local_528;
  string_view local_520;
  bitmask<slang::ast::LookupFlags> local_50c;
  int *local_508;
  ScopedNameSyntax *local_2c8;
  string_view local_2c0;
  undefined8 local_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  bitmask<slang::ast::LookupFlags> local_298 [5];
  LookupFlags local_284;
  InstanceSymbol *local_280;
  bitmask<slang::ast::LookupResultFlags> local_26c [4];
  SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  aSStack_268 [7];
  SourceRange local_40;
  undefined4 local_2c;
  SyntaxNode *local_28;
  byte local_19;
  ArbitrarySymbolExpression *local_8;
  
  local_19 = in_DL & 1;
  local_28 = in_RSI;
  while (local_28->kind == ParenthesizedExpression) {
    slang::syntax::SyntaxNode::as<slang::syntax::ParenthesizedExpressionSyntax>(local_28);
    local_28 = &not_null::operator_cast_to_ExpressionSyntax_
                          ((not_null<slang::syntax::ExpressionSyntax_*> *)0x6d219b)->
                super_SyntaxNode;
  }
  bVar1 = slang::syntax::NameSyntax::isKind(local_28->kind);
  if (!bVar1) {
    if ((local_19 & 1) != 0) {
      local_2c = 0x5f0007;
      local_40 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffff500);
      sourceRange_00.endLoc = in_stack_fffffffffffff4d8;
      sourceRange_00.startLoc = in_stack_fffffffffffff4d0;
      ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff4c8,
                          SUB84((ulong)in_stack_fffffffffffff4e0 >> 0x20,0),sourceRange_00);
    }
    return (Expression *)0x0;
  }
  LookupResult::LookupResult((LookupResult *)in_stack_fffffffffffff4b0);
  local_284 = (local_19 & 1) << 10;
  slang::syntax::SyntaxNode::as<slang::syntax::NameSyntax>(local_28);
  bitmask<slang::ast::LookupFlags>::bitmask(local_298,local_284);
  Lookup::name(in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff89c,
               in_stack_fffffffffffff880);
  slang::syntax::DeferredSourceRange::DeferredSourceRange
            ((DeferredSourceRange *)in_stack_fffffffffffff4b0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2c0);
  if (local_280 == (InstanceSymbol *)0x0) {
    if (local_28->kind == ScopedName) {
      local_2c8 = slang::syntax::SyntaxNode::as<slang::syntax::ScopedNameSyntax>(local_28);
      if ((local_2c8->separator).kind == Dot) {
        pNVar2 = not_null<slang::syntax::NameSyntax_*>::operator->
                           ((not_null<slang::syntax::NameSyntax_*> *)0x6d233e);
        if ((pNVar2->super_ExpressionSyntax).super_SyntaxNode.kind == IdentifierName) {
          LookupResult::LookupResult((LookupResult *)in_stack_fffffffffffff4b0);
          not_null<slang::syntax::NameSyntax_*>::operator*
                    ((not_null<slang::syntax::NameSyntax_*> *)0x6d237a);
          bitmask<slang::ast::LookupFlags>::bitmask(&local_50c,None);
          Lookup::name(in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff89c
                       ,in_stack_fffffffffffff880);
          pSVar3 = (SyntaxNode *)
                   not_null<slang::syntax::NameSyntax_*>::operator->
                             ((not_null<slang::syntax::NameSyntax_*> *)0x6d23da);
          slang::syntax::SyntaxNode::as<slang::syntax::IdentifierNameSyntax>(pSVar3);
          local_520 = parsing::Token::valueText
                                ((Token *)CONCAT44(in_stack_fffffffffffff4c4,
                                                   in_stack_fffffffffffff4c0));
          local_528 = local_508;
          local_2c0 = local_520;
          if (local_508 != (int *)0x0) {
            bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_2c0);
            if ((!bVar1) && ((*local_528 == 0x2b || (*local_528 == 0x31)))) {
              LookupResult::operator=
                        ((LookupResult *)in_stack_fffffffffffff4b0,
                         (LookupResult *)in_stack_fffffffffffff4a8);
              not_null<slang::syntax::NameSyntax_*>::operator*
                        ((not_null<slang::syntax::NameSyntax_*> *)0x6d24d8);
              slang::syntax::DeferredSourceRange::DeferredSourceRange
                        ((DeferredSourceRange *)in_stack_fffffffffffff4b0,
                         (SyntaxNode *)in_stack_fffffffffffff4a8);
              local_2b0 = local_540;
              local_2a8 = local_538;
              local_2a0 = local_530;
            }
          }
          LookupResult::~LookupResult((LookupResult *)in_stack_fffffffffffff4b0);
        }
      }
    }
    if (local_280 == (InstanceSymbol *)0x0) {
      if ((local_19 & 1) != 0) {
        LookupResult::reportDiags
                  ((LookupResult *)in_stack_fffffffffffff4b0,(ASTContext *)in_stack_fffffffffffff4a8
                  );
      }
      local_8 = (ArbitrarySymbolExpression *)0x0;
      local_544 = 1;
      goto LAB_006d371d;
    }
  }
  local_550 = ASTContext::getCompilation((ASTContext *)0x6d25d2);
  local_558 = local_280;
  local_560 = (InterfacePortSymbol *)0x0;
  local_568 = (SourceLocation)0x0;
  if ((local_280->super_InstanceSymbolBase).super_Symbol.kind == InterfacePort) {
    bitmask<slang::ast::LookupResultFlags>::bitmask(&local_569,IfacePort);
    bitmask<slang::ast::LookupResultFlags>::operator|=(local_26c,&local_569);
    SmallVectorBase<slang::ast::HierarchicalReference::Element>::
    emplace_back<slang::ast::Symbol_const&>
              ((SmallVectorBase<slang::ast::HierarchicalReference::Element> *)
               in_stack_fffffffffffff4b8,(Symbol *)in_stack_fffffffffffff4b0);
    local_560 = Symbol::as<slang::ast::InterfacePortSymbol>((Symbol *)0x6d2678);
    local_580 = InterfacePortSymbol::getConnection((InterfacePortSymbol *)in_stack_fffffffffffff4b8)
    ;
    std::tie<slang::ast::Symbol_const*,slang::ast::ModportSymbol_const*>
              ((Symbol **)in_stack_fffffffffffff4b8,(ModportSymbol **)in_stack_fffffffffffff4b0);
    std::tuple<slang::ast::Symbol_const*&,slang::ast::ModportSymbol_const*&>::operator=
              ((tuple<const_slang::ast::Symbol_*&,_const_slang::ast::ModportSymbol_*&> *)
               CONCAT44(in_stack_fffffffffffff4c4,in_stack_fffffffffffff4c0),
               (pair<const_slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*> *)
               in_stack_fffffffffffff4b8);
    if (local_558 != (InstanceSymbol *)0x0) {
      bVar1 = SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
              ::empty(aSStack_268);
      if (!bVar1) {
        SmallVector<const_slang::syntax::ElementSelectSyntax_*,_5UL>::SmallVector
                  ((SmallVector<const_slang::syntax::ElementSelectSyntax_*,_5UL> *)0x6d2738);
        local_5d8 = aSStack_268;
        local_5e0 = SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                    ::begin(local_5d8);
        local_5e8 = SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                    ::end(local_5d8);
        for (; local_5e0 != local_5e8; local_5e0 = local_5e0 + 1) {
          local_5f0 = local_5e0;
          std::
          get<0ul,slang::syntax::ElementSelectSyntax_const*,slang::ast::LookupResult::MemberSelector>
                    ((variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                      *)0x6d27a5);
          SmallVectorBase<const_slang::syntax::ElementSelectSyntax_*>::push_back
                    ((SmallVectorBase<const_slang::syntax::ElementSelectSyntax_*> *)
                     in_stack_fffffffffffff4b0,(ElementSelectSyntax **)in_stack_fffffffffffff4a8);
        }
        std::span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>::
        span<slang::SmallVector<const_slang::syntax::ElementSelectSyntax_*,_5UL>_&>
                  ((span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL> *)
                   CONCAT44(in_stack_fffffffffffff4c4,in_stack_fffffffffffff4c0),
                   (SmallVector<const_slang::syntax::ElementSelectSyntax_*,_5UL> *)
                   in_stack_fffffffffffff4b8);
        selectors_00._M_extent._M_extent_value = in_stack_fffffffffffff5b8._M_extent_value;
        selectors_00._M_ptr = in_stack_fffffffffffff5b0;
        local_558 = (InstanceSymbol *)
                    Lookup::selectChild(in_stack_fffffffffffff5a8,selectors_00,
                                        in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
        SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
        ::clear((SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                 *)in_stack_fffffffffffff4b0);
        SmallVector<const_slang::syntax::ElementSelectSyntax_*,_5UL>::~SmallVector
                  ((SmallVector<const_slang::syntax::ElementSelectSyntax_*,_5UL> *)0x6d288e);
      }
    }
    if (local_558 == (InstanceSymbol *)0x0) {
      LookupResult::reportDiags
                ((LookupResult *)in_stack_fffffffffffff4b0,(ASTContext *)in_stack_fffffffffffff4a8);
      local_8 = (ArbitrarySymbolExpression *)
                badExpr((Compilation *)in_stack_fffffffffffff4b0,
                        (Expression *)in_stack_fffffffffffff4a8);
      local_544 = 1;
      goto LAB_006d371d;
    }
  }
  SmallVector<slang::ConstantRange,_4UL>::SmallVector
            ((SmallVector<slang::ConstantRange,_4UL> *)0x6d28fa);
  local_640 = (LookupResult *)local_558;
  while ((local_558->super_InstanceSymbolBase).super_Symbol.kind == InstanceArray) {
    local_648 = Symbol::as<slang::ast::InstanceArraySymbol>((Symbol *)0x6d2928);
    bVar1 = std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>::empty
                      ((span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *)0x6d2953);
    if (bVar1) {
      local_8 = (ArbitrarySymbolExpression *)
                badExpr((Compilation *)in_stack_fffffffffffff4b0,
                        (Expression *)in_stack_fffffffffffff4a8);
      goto LAB_006d3710;
    }
    SmallVectorBase<slang::ConstantRange>::push_back
              ((SmallVectorBase<slang::ConstantRange> *)in_stack_fffffffffffff4b0,
               (ConstantRange *)in_stack_fffffffffffff4a8);
    ppSVar4 = std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>::operator[]
                        (&local_648->elements,0);
    local_558 = (InstanceSymbol *)*ppSVar4;
  }
  if ((local_558->super_InstanceSymbolBase).super_Symbol.kind == Modport) {
LAB_006d2d18:
    LookupResult::reportDiags
              ((LookupResult *)in_stack_fffffffffffff4b0,(ASTContext *)in_stack_fffffffffffff4a8);
    LookupResult::errorIfSelectors
              ((LookupResult *)in_stack_fffffffffffff4f0,(ASTContext *)in_stack_fffffffffffff4e8);
    local_6b8 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffff500);
    if ((local_558->super_InstanceSymbolBase).super_Symbol.kind == Modport) {
      local_568 = (SourceLocation)Symbol::as<slang::ast::ModportSymbol>((Symbol *)0x6d2dab);
      this = Symbol::getParentScope((Symbol *)local_558);
      Scope::asSymbol(this);
      local_6c0 = Symbol::as<slang::ast::InstanceBodySymbol>((Symbol *)0x6d2e00);
    }
    else {
      pIVar5 = Symbol::as<slang::ast::InstanceSymbol>((Symbol *)0x6d2e29);
      local_6c0 = pIVar5->body;
    }
    if ((local_19 & 1) == 0) {
      if (local_6c0->hierarchyOverrideNode != (HierarchyOverrideNode *)0x0) {
        sourceRange_02.endLoc = in_stack_fffffffffffff4d8;
        sourceRange_02.startLoc = in_stack_fffffffffffff4d0;
        ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff4c8,
                            SUB84((ulong)in_stack_fffffffffffff4e0 >> 0x20,0),sourceRange_02);
        pSVar3 = findOverrideNodeSource(in_stack_fffffffffffff558);
        if (pSVar3 != (SyntaxNode *)0x0) {
          slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffff500);
          range_00.endLoc = in_stack_fffffffffffff4d8;
          range_00.startLoc = in_stack_fffffffffffff4d0;
          Diagnostic::addNote((Diagnostic *)in_stack_fffffffffffff4c8,
                              SUB84((ulong)in_stack_fffffffffffff4e0 >> 0x20,0),range_00);
        }
      }
      if ((local_6c0->parentInstance != (InstanceSymbol *)0x0) &&
         (local_6c0->parentInstance->resolvedConfig != (ResolvedConfig *)0x0)) {
        sourceRange_03.endLoc = in_stack_fffffffffffff4d8;
        sourceRange_03.startLoc = in_stack_fffffffffffff4d0;
        ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff4c8,
                            SUB84((ulong)in_stack_fffffffffffff4e0 >> 0x20,0),sourceRange_03);
        if (local_6c0->parentInstance->resolvedConfig->configRule == (ConfigRule *)0x0) {
          Diagnostic::addNote((Diagnostic *)in_stack_fffffffffffff4b0,in_stack_fffffffffffff4c4,
                              in_stack_fffffffffffff4b8);
        }
        else {
          not_null<const_slang::syntax::SyntaxNode_*>::operator->
                    ((not_null<const_slang::syntax::SyntaxNode_*> *)0x6d3063);
          slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffff500);
          range_01.endLoc = in_stack_fffffffffffff4d8;
          range_01.startLoc = in_stack_fffffffffffff4d0;
          Diagnostic::addNote((Diagnostic *)in_stack_fffffffffffff4c8,
                              SUB84((ulong)in_stack_fffffffffffff4e0 >> 0x20,0),range_01);
        }
      }
    }
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_2c0);
    if (bVar1) {
LAB_006d34b9:
      _Var9._M_extent_value = (size_t)local_6c0->parentInstance;
      pCVar8 = local_550;
      SourceRange::start(&local_6b8);
      scope = BumpAllocator::
              emplace<slang::ast::VirtualInterfaceType,slang::ast::InstanceSymbol_const&,slang::ast::ModportSymbol_const*&,bool,slang::SourceLocation>
                        ((BumpAllocator *)in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8,
                         (ModportSymbol **)
                         CONCAT44(in_stack_fffffffffffff4c4,in_stack_fffffffffffff4c0),
                         (bool *)in_stack_fffffffffffff4b8,
                         (SourceLocation *)in_stack_fffffffffffff4b0);
      bVar1 = SmallVectorBase<slang::ConstantRange>::empty(local_638);
      if (!bVar1) {
        pTVar7 = (Type *)not_null<const_slang::ast::Scope_*>::operator*
                                   ((not_null<const_slang::ast::Scope_*> *)0x6d3569);
        std::span<const_slang::ConstantRange,_18446744073709551615UL>::
        span<slang::SmallVector<slang::ConstantRange,_4UL>_&>
                  ((span<const_slang::ConstantRange,_18446744073709551615UL> *)
                   CONCAT44(in_stack_fffffffffffff4c4,in_stack_fffffffffffff4c0),
                   (SmallVector<slang::ConstantRange,_4UL> *)in_stack_fffffffffffff4b8);
        range.endLoc = in_stack_fffffffffffff4b0;
        range.startLoc = in_stack_fffffffffffff4a8;
        slang::syntax::DeferredSourceRange::DeferredSourceRange
                  ((DeferredSourceRange *)0x6d35bf,range);
        dimensions._M_extent._M_extent_value = _Var9._M_extent_value;
        dimensions._M_ptr = (pointer)pCVar8;
        sourceRange_06.range.endLoc = in_stack_fffffffffffff538;
        sourceRange_06.range.startLoc = in_stack_fffffffffffff530;
        sourceRange_06.node.value = in_stack_fffffffffffff540.value;
        FixedSizeUnpackedArrayType::fromDims((Scope *)scope,pTVar7,dimensions,sourceRange_06);
        in_stack_fffffffffffff4b0 = SStack_840;
      }
      if ((((InstanceSymbolBase *)&local_640->found)->super_Symbol).kind == Modport) {
        in_stack_fffffffffffff4f0 = (Compilation *)Symbol::getParentScope((Symbol *)local_640);
        in_stack_fffffffffffff4e8 =
             (LookupResult *)Scope::asSymbol((Scope *)in_stack_fffffffffffff4f0);
        local_640 = in_stack_fffffffffffff4e8;
        in_stack_fffffffffffff4e0 = Symbol::as<slang::ast::InstanceBodySymbol>((Symbol *)0x6d365a);
        local_640 = (LookupResult *)in_stack_fffffffffffff4e0->parentInstance;
      }
      HierarchicalReference::fromLookup(in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
      pCVar8 = local_550;
      pTVar7 = (Type *)not_null<const_slang::ast::Scope_*>::operator*
                                 ((not_null<const_slang::ast::Scope_*> *)0x6d36ab);
      local_8 = BumpAllocator::
                emplace<slang::ast::ArbitrarySymbolExpression,slang::ast::Scope_const&,slang::ast::Symbol_const&,slang::ast::Type_const&,slang::ast::HierarchicalReference*,slang::SourceRange&>
                          (&in_stack_fffffffffffff4f0->super_BumpAllocator,
                           (Scope *)in_stack_fffffffffffff4e8,
                           &in_stack_fffffffffffff4e0->super_Symbol,pTVar7,
                           (HierarchicalReference **)pCVar8,(SourceRange *)in_stack_fffffffffffff4c8
                          );
    }
    else if (local_568 == (SourceLocation)0x0) {
      name._M_str = in_stack_fffffffffffff518;
      name._M_len = in_stack_fffffffffffff510;
      pSVar6 = Scope::find(in_stack_fffffffffffff508,name);
      if ((pSVar6 != (Symbol *)0x0) && (pSVar6->kind == Modport)) {
        in_stack_fffffffffffff530 =
             (SourceLocation)Symbol::as<slang::ast::ModportSymbol>((Symbol *)0x6d349d);
        local_568 = in_stack_fffffffffffff530;
        goto LAB_006d34b9;
      }
      slang::syntax::DeferredSourceRange::operator*((DeferredSourceRange *)0x6d335c);
      sourceRange_05.endLoc = in_stack_fffffffffffff4d8;
      sourceRange_05.startLoc = in_stack_fffffffffffff4d0;
      ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff4c8,
                          SUB84((ulong)in_stack_fffffffffffff4e0 >> 0x20,0),sourceRange_05);
      arg_03._M_str = (char *)in_stack_fffffffffffff500;
      arg_03._M_len = in_stack_fffffffffffff4f8;
      Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffff4f0,arg_03);
      InstanceBodySymbol::getDefinition(local_6c0);
      arg_04._M_str = (char *)in_stack_fffffffffffff500;
      arg_04._M_len = in_stack_fffffffffffff4f8;
      Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffff4f0,arg_04);
      local_8 = (ArbitrarySymbolExpression *)
                badExpr((Compilation *)in_stack_fffffffffffff4b0,
                        (Expression *)in_stack_fffffffffffff4a8);
    }
    else {
      slang::syntax::DeferredSourceRange::operator*((DeferredSourceRange *)0x6d3166);
      sourceRange_04.endLoc = in_stack_fffffffffffff4d8;
      sourceRange_04.startLoc = in_stack_fffffffffffff4d0;
      ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff4c8,
                          SUB84((ulong)in_stack_fffffffffffff4e0 >> 0x20,0),sourceRange_04);
      arg_00._M_str = (char *)in_stack_fffffffffffff500;
      arg_00._M_len = in_stack_fffffffffffff4f8;
      Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffff4f0,arg_00);
      InstanceBodySymbol::getDefinition(local_6c0);
      arg_01._M_str = (char *)in_stack_fffffffffffff500;
      arg_01._M_len = in_stack_fffffffffffff4f8;
      Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffff4f0,arg_01);
      arg_02._M_str = (char *)in_stack_fffffffffffff500;
      arg_02._M_len = in_stack_fffffffffffff4f8;
      Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffff4f0,arg_02);
      local_8 = (ArbitrarySymbolExpression *)
                badExpr((Compilation *)in_stack_fffffffffffff4b0,
                        (Expression *)in_stack_fffffffffffff4a8);
    }
  }
  else {
    if ((local_558->super_InstanceSymbolBase).super_Symbol.kind == Instance) {
      Symbol::as<slang::ast::InstanceSymbol>((Symbol *)0x6d2a28);
      bVar1 = InstanceSymbol::isInterface((InstanceSymbol *)0x6d2a3f);
      if (bVar1) goto LAB_006d2d18;
    }
    if ((local_558->super_InstanceSymbolBase).super_Symbol.kind == UninstantiatedDef) {
LAB_006d2acb:
      not_null<const_slang::ast::Scope_*>::operator*
                ((not_null<const_slang::ast::Scope_*> *)0x6d2ae8);
      Compilation::getErrorType(local_550);
      local_650 = 0;
      local_660 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffff500);
      local_8 = BumpAllocator::
                emplace<slang::ast::ArbitrarySymbolExpression,slang::ast::Scope_const&,slang::ast::Symbol_const&,slang::ast::Type_const&,decltype(nullptr),slang::SourceRange>
                          (&in_stack_fffffffffffff4f0->super_BumpAllocator,
                           (Scope *)in_stack_fffffffffffff4e8,
                           &in_stack_fffffffffffff4e0->super_Symbol,
                           (Type *)in_stack_fffffffffffff4d8,(void **)in_stack_fffffffffffff4d0,
                           (SourceRange *)in_stack_fffffffffffff4c8);
    }
    else {
      if ((local_558->super_InstanceSymbolBase).super_Symbol.kind == Variable) {
        Symbol::as<slang::ast::VariableSymbol>((Symbol *)0x6d2a84);
        ValueSymbol::getType((ValueSymbol *)0x6d2a9b);
        bVar1 = Type::isError((Type *)0x6d2ab2);
        if (bVar1) goto LAB_006d2acb;
      }
      code = SUB84((ulong)in_stack_fffffffffffff4e0 >> 0x20,0);
      if ((local_19 & 1) != 0) {
        bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                          (&(((InstanceSymbolBase *)&local_640->found)->super_Symbol).name);
        if (!bVar1) {
          local_66c = 0x26000a;
          local_680 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffff500);
          sourceRange_01.endLoc = in_stack_fffffffffffff4d8;
          sourceRange_01.startLoc = in_stack_fffffffffffff4d0;
          ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff4c8,code,sourceRange_01);
          local_698 = (((InstanceSymbolBase *)&local_640->found)->super_Symbol).name._M_len;
          pcStack_690 = (((InstanceSymbolBase *)&local_640->found)->super_Symbol).name._M_str;
          arg._M_str = (char *)in_stack_fffffffffffff500;
          arg._M_len = in_stack_fffffffffffff4f8;
          local_668 = Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffff4f0,arg);
          local_69c = 0x50001;
          local_6a8 = (((InstanceSymbolBase *)&local_640->found)->super_Symbol).location;
          Diagnostic::addNote((Diagnostic *)in_stack_fffffffffffff4b0,in_stack_fffffffffffff4c4,
                              in_stack_fffffffffffff4b8);
        }
      }
      local_8 = (ArbitrarySymbolExpression *)0x0;
    }
  }
LAB_006d3710:
  local_544 = 1;
  SmallVector<slang::ConstantRange,_4UL>::~SmallVector
            ((SmallVector<slang::ConstantRange,_4UL> *)0x6d371d);
LAB_006d371d:
  LookupResult::~LookupResult((LookupResult *)in_stack_fffffffffffff4b0);
  return &local_8->super_Expression;
}

Assistant:

Expression* Expression::tryBindInterfaceRef(const ASTContext& context,
                                            const ExpressionSyntax& syntax, bool isInterfacePort) {
    // Unwrap the expression; parentheses are superfluous.
    const ExpressionSyntax* expr = &syntax;
    while (expr->kind == SyntaxKind::ParenthesizedExpression)
        expr = expr->as<ParenthesizedExpressionSyntax>().expression;

    // Connection must be a name (not some arbitrary expression).
    if (!NameSyntax::isKind(expr->kind)) {
        if (isInterfacePort)
            context.addDiag(diag::InterfacePortInvalidExpression, expr->sourceRange());
        return nullptr;
    }

    // Try to look up that name.
    LookupResult result;
    auto flags = isInterfacePort ? LookupFlags::IfacePortConn : LookupFlags::None;
    Lookup::name(expr->as<NameSyntax>(), context, flags, result);

    DeferredSourceRange modportRange;
    std::string_view arrayModportName;
    if (!result.found) {
        // We didn't find the name as-is. This might be a case where the user has
        // provided an explicit modport name on top of an array of interfaces,
        // which we should support by looking up the name again without the trailing
        // name component and taking the result if it's an iface array.
        if (expr->kind == SyntaxKind::ScopedName) {
            auto& scoped = expr->as<ScopedNameSyntax>();
            if (scoped.separator.kind == TokenKind::Dot &&
                scoped.right->kind == SyntaxKind::IdentifierName) {
                LookupResult result2;
                Lookup::name(*scoped.left, context, LookupFlags::None, result2);
                arrayModportName = scoped.right->as<IdentifierNameSyntax>().identifier.valueText();

                auto found = result2.found;
                if (found && !arrayModportName.empty() &&
                    (found->kind == SymbolKind::InterfacePort ||
                     found->kind == SymbolKind::InstanceArray)) {
                    result = result2;
                    modportRange = *scoped.right;
                }
            }
        }

        // If still not found we can't make a connection. Error if this is for a
        // port, and otherwise return null to let the caller try binding as a
        // normal expression.
        if (!result.found) {
            if (isInterfacePort)
                result.reportDiags(context);
            return nullptr;
        }
    }

    auto& comp = context.getCompilation();
    auto symbol = result.found;
    const InterfacePortSymbol* ifacePort = nullptr;
    const ModportSymbol* modport = nullptr;

    // If we found an interface port we should unwrap to what it's connected to.
    if (symbol->kind == SymbolKind::InterfacePort) {
        result.flags |= LookupResultFlags::IfacePort;
        result.path.emplace_back(*symbol);

        ifacePort = &symbol->as<InterfacePortSymbol>();
        std::tie(symbol, modport) = ifacePort->getConnection();

        if (symbol && !result.selectors.empty()) {
            SmallVector<const ElementSelectSyntax*> selectors;
            for (auto& sel : result.selectors)
                selectors.push_back(std::get<0>(sel));

            symbol = Lookup::selectChild(*symbol, selectors, context, result);
            result.selectors.clear();
        }

        if (!symbol) {
            // Returning nullptr from this function means to try doing normal expression
            // creation, but if we hit this case here we found the iface and simply failed
            // to connect it, likely because we're in an uninstantiated context. Return
            // a badExpr here to silence any follow on errors that might otherwise result.
            result.reportDiags(context);
            return &badExpr(comp, nullptr);
        }
    }

    // Unwrap any interface arrays we found, collect the dimensions along the way.
    SmallVector<ConstantRange, 4> dims;
    auto origSymbol = symbol;
    while (symbol->kind == SymbolKind::InstanceArray) {
        auto& array = symbol->as<InstanceArraySymbol>();
        if (array.elements.empty())
            return &badExpr(comp, nullptr);

        dims.push_back(array.range);
        symbol = array.elements[0];
    }

    // If we didn't find a modport or an interface instance then this is not
    // an interface connection.
    if (symbol->kind != SymbolKind::Modport &&
        (symbol->kind != SymbolKind::Instance || !symbol->as<InstanceSymbol>().isInterface())) {
        // If this is a variable with an errored type, an error is already emitted.
        if (symbol->kind == SymbolKind::UninstantiatedDef ||
            (symbol->kind == SymbolKind::Variable &&
             symbol->as<VariableSymbol>().getType().isError())) {
            return comp.emplace<ArbitrarySymbolExpression>(*context.scope, *origSymbol,
                                                           comp.getErrorType(), nullptr,
                                                           syntax.sourceRange());
        }

        if (isInterfacePort && !origSymbol->name.empty()) {
            auto& diag = context.addDiag(diag::NotAnInterface, syntax.sourceRange())
                         << origSymbol->name;
            diag.addNote(diag::NoteDeclarationHere, origSymbol->location);
        }

        // Return nullptr to let the parent try normal expression binding.
        return nullptr;
    }

    // At this point we've found a connection so we're no longer speculatively
    // trying to connect, we're going to connect or issue an error.
    result.reportDiags(context);
    result.errorIfSelectors(context);

    auto sourceRange = syntax.sourceRange();
    const InstanceBodySymbol* iface = nullptr;
    if (symbol->kind == SymbolKind::Modport) {
        modport = &symbol->as<ModportSymbol>();
        iface = &symbol->getParentScope()->asSymbol().as<InstanceBodySymbol>();
    }
    else {
        iface = &symbol->as<InstanceSymbol>().body;
    }

    if (!isInterfacePort) {
        if (iface->hierarchyOverrideNode) {
            auto& diag = context.addDiag(diag::VirtualIfaceDefparam, sourceRange);
            if (auto source = findOverrideNodeSource(*iface->hierarchyOverrideNode))
                diag.addNote(diag::NoteDeclarationHere, source->sourceRange());
        }

        if (iface->parentInstance && iface->parentInstance->resolvedConfig) {
            auto& diag = context.addDiag(diag::VirtualIfaceConfigRule, sourceRange);

            auto rc = iface->parentInstance->resolvedConfig;
            if (rc->configRule)
                diag.addNote(diag::NoteConfigRule, rc->configRule->syntax->sourceRange());
            else
                diag.addNote(diag::NoteConfigRule, rc->useConfig.location);
        }
    }

    if (!arrayModportName.empty()) {
        if (modport) {
            // If we connected via an interface port that itself has a modport restriction,
            // we can't also be restricting via an interface array modport.
            auto& diag = context.addDiag(diag::InvalidModportAccess, *modportRange);
            diag << arrayModportName;
            diag << iface->getDefinition().name;
            diag << modport->name;
            return &badExpr(comp, nullptr);
        }
        else {
            auto sym = iface->find(arrayModportName);
            if (!sym || sym->kind != SymbolKind::Modport) {
                auto& diag = context.addDiag(diag::NotAModport, *modportRange);
                diag << arrayModportName;
                diag << iface->getDefinition().name;
                return &badExpr(comp, nullptr);
            }

            modport = &sym->as<ModportSymbol>();
        }
    }

    // Now make sure the interface or modport we found matches the target type.
    // Fabricate a virtual interface type for the rhs that we can use for matching.
    SLANG_ASSERT(iface->parentInstance);
    const Type* type = comp.emplace<VirtualInterfaceType>(*iface->parentInstance, modport,
                                                          /* isRealIface */ true,
                                                          sourceRange.start());
    if (!dims.empty())
        type = &FixedSizeUnpackedArrayType::fromDims(*context.scope, *type, dims, sourceRange);

    // Don't return a modport as the symbol target, it's expected that it
    // will be pulled from the virtual interface type instead.
    if (origSymbol->kind == SymbolKind::Modport) {
        origSymbol = &origSymbol->getParentScope()->asSymbol();
        origSymbol = origSymbol->as<InstanceBodySymbol>().parentInstance;
    }

    auto hierRef = HierarchicalReference::fromLookup(comp, result);
    return comp.emplace<ArbitrarySymbolExpression>(*context.scope, *origSymbol, *type, &hierRef,
                                                   sourceRange);
}